

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_endec_filter_test.cxx
# Opt level: O0

void __thiscall rotating_endec_filter_test::test_method(rotating_endec_filter_test *this)

{
  ulong uVar1;
  size_type sVar2;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_58;
  uchar *local_50;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_48;
  ulong local_40;
  size_t i;
  size_t increment;
  size_t initial;
  vector<unsigned_char,_std::allocator<unsigned_char>_> input;
  rotating_endec_filter_test *this_local;
  
  input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  cryptox::detail::make_random_vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&initial,0x4000);
  increment = 0;
  i = 1;
  local_40 = 0;
  while( true ) {
    uVar1 = local_40;
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&initial);
    if (sVar2 <= uVar1) break;
    local_48._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&initial);
    local_58._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&initial);
    local_50 = (uchar *)__gnu_cxx::
                        __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::operator+(&local_58,local_40);
    roundtrip_test<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (local_48,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         )local_50);
    local_40 = i + local_40;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&initial);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(rotating_endec_filter_test) {
	std::vector<std::uint8_t> input = cryptox::detail::make_random_vector(16*1024);

	//
	// Slice input and test along...
	//
	const size_t initial = 0;
	size_t increment = 1;
	for (size_t i=initial; i<input.size(); i+=increment)
		roundtrip_test(input.begin(), input.begin() + i);
}